

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

void __thiscall pbrt::ThreadPool::workerFunc(ThreadPool *this,int tIndex)

{
  undefined4 in_ESI;
  mutex_type *in_RDI;
  long *in_FS_OFFSET;
  int *in_stack_00000010;
  unique_lock<std::mutex> lock;
  undefined4 in_stack_00000028;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd8;
  ThreadPool *in_stack_ffffffffffffffe0;
  
  if (LOGGING_LogLevel < 1) {
    Log<int&>(this._4_4_,(char *)CONCAT44(tIndex,in_stack_00000028),lock._12_4_,
              (char *)lock._M_device,in_stack_00000010);
  }
  *(undefined4 *)(*in_FS_OFFSET + -0x130) = in_ESI;
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,in_RDI);
  while (((in_RDI[3].super___mutex_base._M_mutex.__size[0] ^ 0xffU) & 1) != 0) {
    WorkOrWait(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if (LOGGING_LogLevel < 1) {
    Log<int&>(this._4_4_,(char *)CONCAT44(tIndex,in_stack_00000028),lock._12_4_,
              (char *)lock._M_device,in_stack_00000010);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void ThreadPool::workerFunc(int tIndex) {
    LOG_VERBOSE("Started execution in worker thread %d", tIndex);
    ThreadIndex = tIndex;

    std::unique_lock<std::mutex> lock(jobListMutex);
    while (!shutdownThreads)
        WorkOrWait(&lock);

    LOG_VERBOSE("Exiting worker thread %d", tIndex);
}